

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O2

void Gia_ManFraStop(Gia_ManFra_t *p)

{
  Vec_VecFree((Vec_Vec_t *)p->vIns);
  Vec_VecFree((Vec_Vec_t *)p->vAnds);
  Vec_VecFree((Vec_Vec_t *)p->vOuts);
  free(p);
  return;
}

Assistant:

void Gia_ManFraStop( Gia_ManFra_t * p )  
{
    Vec_VecFree( (Vec_Vec_t *)p->vIns );
    Vec_VecFree( (Vec_Vec_t *)p->vAnds );
    Vec_VecFree( (Vec_Vec_t *)p->vOuts );
    ABC_FREE( p );
}